

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O0

void __thiscall
CTcParser::parse_formal_list
          (CTcParser *this,int count_only,int opt_allowed,int *argc,int *opt_argc,int *varargs,
          int *varargs_list,CTcSymLocal **varargs_list_local,int *err,int base_formal_num,
          int for_short_anon_func,CTcFormalTypeList **type_list)

{
  bool bVar1;
  tc_toktyp_t tVar2;
  tc_toktyp_t tVar3;
  tc_symtype_t tVar4;
  int iVar5;
  CTcToken *pCVar6;
  CTcSymLocal *pCVar7;
  CTcSymbol *this_00;
  long *plVar8;
  size_t sVar9;
  char *pcVar10;
  CTcFormalTypeList *pCVar11;
  int *in_RCX;
  int in_EDX;
  int in_ESI;
  CTcParser *in_RDI;
  int *in_R8;
  int *in_R9;
  bool bVar12;
  undefined4 *in_stack_00000008;
  undefined8 *in_stack_00000010;
  undefined4 *in_stack_00000018;
  int in_stack_00000028;
  long *in_stack_00000030;
  CTcSymbol *clsym;
  CTcToken init_tok;
  int local_id;
  CTcPrsNode *defval_expr;
  tc_toktyp_t suffix_tok;
  int done;
  int missing_end_tok_err;
  tc_toktyp_t end_tok;
  int defval_cnt;
  int is_typed;
  int opt_param;
  int named_param;
  CTcToken varname;
  CTcSymLocal *lcl;
  undefined4 in_stack_fffffffffffffe68;
  int in_stack_fffffffffffffe6c;
  CTcTokenizer *in_stack_fffffffffffffe70;
  CTcTokenizer *in_stack_fffffffffffffe78;
  CTcTokenizer *in_stack_fffffffffffffe80;
  vm_obj_id_t in_stack_fffffffffffffe88;
  tc_toktyp_t in_stack_fffffffffffffe8c;
  CTcPrsSymtab *in_stack_fffffffffffffe90;
  char *in_stack_fffffffffffffe98;
  CTcPrsSymtab *in_stack_fffffffffffffea0;
  CTcPrsSymtab *in_stack_fffffffffffffea8;
  size_t in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb8;
  uint in_stack_fffffffffffffebc;
  uint in_stack_fffffffffffffec0;
  undefined1 local_b0 [4];
  CTcPrsNode *local_80;
  int local_68;
  int local_60;
  int local_5c;
  CTcToken local_58;
  CTcSymLocalBase *local_30;
  int *local_28;
  int *local_20;
  int *local_18;
  int local_10;
  int local_c;
  
  local_30 = (CTcSymLocalBase *)0x0;
  local_28 = in_R9;
  local_20 = in_R8;
  local_18 = in_RCX;
  local_10 = in_EDX;
  local_c = in_ESI;
  CTcToken::CTcToken(&local_58);
  local_68 = 0;
  tVar2 = TOKT_RPAR;
  if (in_stack_00000028 != 0) {
    tVar2 = TOKT_COLON;
  }
  *local_18 = 0;
  if (local_20 != (int *)0x0) {
    *local_20 = 0;
  }
  *local_28 = 0;
  *in_stack_00000008 = 0;
  *in_stack_00000018 = 0;
  tVar3 = CTcTokenizer::cur((CTcTokenizer *)0x26495f);
  bVar12 = tVar3 == tVar2;
  if (bVar12) {
    CTcTokenizer::next(in_stack_fffffffffffffe78);
  }
LAB_00264984:
  if (bVar12) {
    tVar3 = CTcTokenizer::cur((CTcTokenizer *)0x26562a);
    if ((tVar3 == TOKT_SYM) &&
       (iVar5 = CTcTokenizer::cur_tok_matches
                          (in_stack_fffffffffffffe80,(char *)in_stack_fffffffffffffe78,
                           (size_t)in_stack_fffffffffffffe70), iVar5 != 0)) {
      if ((in_stack_00000030 == (long *)0x0) || (tVar2 != TOKT_RPAR)) {
        CTcTokenizer::log_error(0x2bc9);
      }
      else if (*in_stack_00000030 == 0) {
        pCVar11 = (CTcFormalTypeList *)
                  operator_new((size_t)in_stack_fffffffffffffe70,
                               (CTcPrsMem *)
                               CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
        CTcFormalTypeList::CTcFormalTypeList(pCVar11);
        *in_stack_00000030 = (long)pCVar11;
        CTcFormalTypeList::add_untyped_params
                  ((CTcFormalTypeList *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
        if (*local_28 != 0) {
          CTcFormalTypeList::add_ellipsis((CTcFormalTypeList *)*in_stack_00000030);
        }
      }
      CTcTokenizer::next(in_stack_fffffffffffffe78);
    }
    if (local_20 != (int *)0x0) {
      *local_18 = *local_18 - *local_20;
    }
    return;
  }
  tVar3 = CTcTokenizer::cur((CTcTokenizer *)0x2649c0);
  switch(tVar3) {
  case TOKT_EOF:
  case TOKT_LBRACE:
  case TOKT_RBRACE:
  case TOKT_SEM:
    CTcTokenizer::log_error_curtok(in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
    bVar12 = true;
    goto LAB_00264984;
  default:
    tVar3 = CTcTokenizer::cur((CTcTokenizer *)0x26557b);
    if (tVar3 == tVar2) {
      CTcTokenizer::log_error(0x2b1d);
      CTcTokenizer::next(in_stack_fffffffffffffe78);
      bVar12 = true;
    }
    else if (in_stack_00000028 == 0) {
      CTcTokenizer::log_error_curtok(in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
      CTcTokenizer::next(in_stack_fffffffffffffe78);
    }
    else {
      CTcTokenizer::log_error_curtok(in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
      bVar12 = true;
    }
    goto LAB_00264984;
  case TOKT_SYM:
    bVar1 = false;
    if (in_stack_00000030 != (long *)0x0) {
      pCVar6 = CTcTokenizer::copycur
                         ((CTcTokenizer *)
                          CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      memcpy(local_b0,pCVar6,0x28);
      tVar3 = CTcTokenizer::next(in_stack_fffffffffffffe78);
      if (tVar3 == TOKT_SYM) {
        if (*in_stack_00000030 == 0) {
          pCVar11 = (CTcFormalTypeList *)
                    operator_new((size_t)in_stack_fffffffffffffe70,
                                 (CTcPrsMem *)
                                 CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
          CTcFormalTypeList::CTcFormalTypeList(pCVar11);
          *in_stack_00000030 = (long)pCVar11;
          CTcFormalTypeList::add_untyped_params
                    ((CTcFormalTypeList *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
        }
        CTcFormalTypeList::add_typed_param
                  ((CTcFormalTypeList *)in_stack_fffffffffffffe80,
                   (CTcToken *)in_stack_fffffffffffffe78);
        bVar1 = true;
        CTcToken::get_text((CTcToken *)local_b0);
        CTcToken::get_text_len((CTcToken *)local_b0);
        this_00 = CTcPrsSymtab::find((CTcPrsSymtab *)in_stack_fffffffffffffe70,
                                     (textchar_t *)
                                     CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                                     0x264f14);
        if (this_00 == (CTcSymbol *)0x0) {
          plVar8 = (long *)CTcSymbolBase::operator_new(0x264f35);
          CTcToken::get_text((CTcToken *)local_b0);
          CTcToken::get_text_len((CTcToken *)local_b0);
          CTcGenTarg::new_obj_id(G_cg);
          in_stack_fffffffffffffe70 = (CTcTokenizer *)0x0;
          in_stack_fffffffffffffe68 = 0;
          CTcSymObj::CTcSymObj
                    ((CTcSymObj *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                     (size_t)in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,
                     in_stack_fffffffffffffe88,(int)((ulong)in_stack_fffffffffffffe80 >> 0x20),
                     (tc_metaclass_t)in_stack_fffffffffffffeb0,
                     (CTcDictEntry *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
          (**(code **)(*plVar8 + 0x78))();
          (*in_RDI->global_symtab_->_vptr_CTcPrsSymtab[3])(in_RDI->global_symtab_,plVar8);
        }
        else {
          tVar4 = CTcSymbolBase::get_type(&this_00->super_CTcSymbolBase);
          if ((tVar4 != TC_SYM_OBJ) &&
             (tVar4 = CTcSymbolBase::get_type(&this_00->super_CTcSymbolBase),
             tVar4 != TC_SYM_METACLASS)) {
            sVar9 = CTcToken::get_text_len((CTcToken *)local_b0);
            pcVar10 = CTcToken::get_text((CTcToken *)local_b0);
            CTcTokenizer::log_error(0x2bca,sVar9 & 0xffffffff,pcVar10);
          }
        }
      }
      else {
        CTcTokenizer::unget((CTcTokenizer *)0x265075);
        bVar1 = false;
      }
    }
    pCVar6 = CTcTokenizer::getcur(G_tok);
    memcpy(&local_58,pCVar6,0x21);
    CTcTokenizer::next(in_stack_fffffffffffffe78);
    local_5c = 0;
    tVar3 = CTcTokenizer::cur((CTcTokenizer *)0x2650cf);
    if (tVar3 == TOKT_COLON) {
      local_5c = 1;
      if (in_stack_00000028 == 0) {
        CTcTokenizer::next(in_stack_fffffffffffffe78);
      }
      else {
        tVar3 = CTcTokenizer::next(in_stack_fffffffffffffe78);
        if ((tVar3 != TOKT_COMMA) && (tVar3 != TOKT_COLON)) {
          local_5c = 0;
          CTcTokenizer::unget((CTcTokenizer *)0x265130);
        }
      }
      if ((local_5c != 0) && (bVar1)) {
        sVar9 = CTcToken::get_text_len(&local_58);
        in_stack_fffffffffffffec0 = (uint)sVar9;
        pcVar10 = CTcToken::get_text(&local_58);
        CTcTokenizer::log_error(0x2bd1,(ulong)in_stack_fffffffffffffec0,pcVar10);
      }
    }
    local_60 = 0;
    tVar3 = CTcTokenizer::cur((CTcTokenizer *)0x2651a2);
    local_80 = (CTcPrsNode *)0x0;
    if ((local_10 != 0) && ((tVar3 == TOKT_QUESTION || (tVar3 == TOKT_EQ)))) {
      local_60 = 1;
      if ((local_20 != (int *)0x0) && (local_5c == 0)) {
        *local_20 = *local_20 + 1;
      }
      CTcTokenizer::next(in_stack_fffffffffffffe78);
      if (tVar3 == TOKT_EQ) {
        local_80 = parse_asi_expr((CTcParser *)0x265228);
      }
    }
    if ((((local_10 != 0) && (local_20 != (int *)0x0)) && (*local_20 != 0)) &&
       ((local_60 == 0 && (local_5c == 0)))) {
      sVar9 = CTcToken::get_text_len(&local_58);
      in_stack_fffffffffffffebc = (uint)sVar9;
      pcVar10 = CTcToken::get_text(&local_58);
      CTcTokenizer::log_error(0x2bd0,(ulong)in_stack_fffffffffffffebc,pcVar10);
    }
    local_30 = (CTcSymLocalBase *)0x0;
    if (local_c == 0) {
      create_scope_local_symtab((CTcParser *)in_stack_fffffffffffffe80);
      if ((local_5c == 0) && (local_60 == 0)) {
        in_stack_fffffffffffffe90 = in_RDI->local_symtab_;
        in_stack_fffffffffffffe98 = CTcToken::get_text(&local_58);
        CTcToken::get_text_len(&local_58);
        local_30 = &CTcPrsSymtab::add_formal
                              (in_stack_fffffffffffffea8,(textchar_t *)in_stack_fffffffffffffea0,
                               (size_t)in_stack_fffffffffffffe98,
                               (int)((ulong)in_stack_fffffffffffffe90 >> 0x20),
                               (int)in_stack_fffffffffffffe90)->super_CTcSymLocalBase;
      }
      else {
        in_stack_fffffffffffffea0 = in_RDI->local_symtab_;
        in_stack_fffffffffffffea8 = (CTcPrsSymtab *)CTcToken::get_text(&local_58);
        in_stack_fffffffffffffeb0 = CTcToken::get_text_len(&local_58);
        alloc_local(in_RDI);
        in_stack_fffffffffffffe68 = 0;
        local_30 = &CTcPrsSymtab::add_local
                              (in_stack_fffffffffffffea8,(textchar_t *)in_stack_fffffffffffffea0,
                               (size_t)in_stack_fffffffffffffe98,
                               (int)((ulong)in_stack_fffffffffffffe90 >> 0x20),
                               (int)in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,
                               in_stack_fffffffffffffec0)->super_CTcSymLocalBase;
        CTcSymLocalBase::set_named_param(local_30,local_5c);
        CTcSymLocalBase::set_opt_param(local_30,local_60);
        if (local_80 != (CTcPrsNode *)0x0) {
          CTcSymLocalBase::set_defval_expr(local_30,local_80,local_68);
          local_68 = local_68 + 1;
        }
      }
      if ((local_5c == 0) && (local_30 != (CTcSymLocalBase *)0x0)) {
        CTcSymLocalBase::set_param_index(local_30,*local_18);
      }
    }
    if ((((local_5c == 0) && (*local_18 = *local_18 + 1, in_stack_00000030 != (long *)0x0)) &&
        (*in_stack_00000030 != 0)) && (!bVar1)) {
      CTcFormalTypeList::add_untyped_param((CTcFormalTypeList *)in_stack_fffffffffffffe70);
    }
    tVar3 = CTcTokenizer::cur((CTcTokenizer *)0x265491);
    if (tVar3 != tVar2) {
      in_stack_fffffffffffffe8c = CTcTokenizer::cur((CTcTokenizer *)0x2654ae);
      if (in_stack_fffffffffffffe8c != TOKT_EOF) {
        if (in_stack_fffffffffffffe8c == TOKT_SYM) {
          CTcTokenizer::log_error_curtok(in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
        }
        else if (in_stack_fffffffffffffe8c == TOKT_COMMA) {
          CTcTokenizer::next(in_stack_fffffffffffffe78);
        }
        else if (((1 < in_stack_fffffffffffffe8c - TOKT_LBRACE) &&
                 (in_stack_fffffffffffffe8c != TOKT_EQ)) && (in_stack_fffffffffffffe8c != TOKT_SEM))
        {
          CTcTokenizer::log_error_curtok(in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
          CTcTokenizer::next(in_stack_fffffffffffffe78);
        }
      }
      goto LAB_00264984;
    }
    break;
  case TOKT_LBRACK:
    *local_28 = 1;
    if ((in_stack_00000030 != (long *)0x0) && (*in_stack_00000030 != 0)) {
      CTcFormalTypeList::add_ellipsis((CTcFormalTypeList *)*in_stack_00000030);
    }
    tVar3 = CTcTokenizer::next(in_stack_fffffffffffffe78);
    if (tVar3 == TOKT_SYM) {
      if (local_c == 0) {
        create_scope_local_symtab((CTcParser *)in_stack_fffffffffffffe80);
        *in_stack_00000008 = 1;
        alloc_local(in_RDI);
        pCVar6 = CTcTokenizer::getcur(G_tok);
        CTcToken::get_text(pCVar6);
        pCVar6 = CTcTokenizer::getcur(G_tok);
        CTcToken::get_text_len(pCVar6);
        in_stack_fffffffffffffe68 = 0;
        pCVar7 = CTcPrsSymtab::add_local
                           (in_stack_fffffffffffffea8,(textchar_t *)in_stack_fffffffffffffea0,
                            (size_t)in_stack_fffffffffffffe98,
                            (int)((ulong)in_stack_fffffffffffffe90 >> 0x20),
                            (int)in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,
                            in_stack_fffffffffffffec0);
        *in_stack_00000010 = pCVar7;
        CTcSymLocalBase::set_list_param((CTcSymLocalBase *)*in_stack_00000010,1);
      }
      tVar3 = CTcTokenizer::next(in_stack_fffffffffffffe78);
      if ((tVar3 == TOKT_EOF) || (tVar3 - TOKT_LBRACE < 2)) {
        CTcTokenizer::log_error_curtok(in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
        bVar12 = true;
        goto LAB_00264984;
      }
      if (tVar3 != TOKT_RBRACK) {
        CTcTokenizer::log_error_curtok(in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
        CTcTokenizer::next(in_stack_fffffffffffffe78);
        bVar12 = true;
        goto LAB_00264984;
      }
      tVar3 = CTcTokenizer::next(in_stack_fffffffffffffe78);
      if (tVar3 != tVar2) {
        tVar3 = CTcTokenizer::cur((CTcTokenizer *)0x264c5e);
        if ((tVar3 != TOKT_EOF) && (tVar3 != TOKT_LPAR)) {
          if (tVar3 == TOKT_COMMA) {
            CTcTokenizer::log_error(0x2b7d);
            goto LAB_00264984;
          }
          if (1 < tVar3 - TOKT_LBRACE) {
            CTcTokenizer::log_error_curtok(in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
            tVar3 = CTcTokenizer::next(in_stack_fffffffffffffe78);
            if (tVar3 == tVar2) {
              CTcTokenizer::next(in_stack_fffffffffffffe78);
            }
            bVar12 = true;
            goto LAB_00264984;
          }
        }
        CTcTokenizer::log_error_curtok(in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
        bVar12 = true;
        goto LAB_00264984;
      }
    }
    else {
      if (tVar3 == TOKT_RBRACK) goto LAB_002649fc;
      CTcTokenizer::log_error_curtok(in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
      tVar3 = CTcTokenizer::cur((CTcTokenizer *)0x264d8a);
      if (tVar3 != tVar2) {
        tVar3 = CTcTokenizer::cur((CTcTokenizer *)0x264da7);
        if ((tVar3 == TOKT_EOF) || (tVar3 == TOKT_LBRACE || tVar3 == TOKT_RBRACE)) {
          bVar12 = true;
        }
        else {
          CTcTokenizer::next(in_stack_fffffffffffffe78);
        }
        goto LAB_00264984;
      }
    }
    break;
  case TOKT_ELLIPSIS:
    *local_28 = 1;
LAB_002649fc:
    if ((in_stack_00000030 != (long *)0x0) && (*in_stack_00000030 != 0)) {
      CTcFormalTypeList::add_ellipsis((CTcFormalTypeList *)*in_stack_00000030);
    }
    tVar3 = CTcTokenizer::next(in_stack_fffffffffffffe78);
    if (tVar3 == tVar2) break;
    tVar3 = CTcTokenizer::cur((CTcTokenizer *)0x264a51);
    if (tVar3 == TOKT_COMMA) {
      CTcTokenizer::next(in_stack_fffffffffffffe78);
      CTcTokenizer::log_error(0x2b27);
    }
    else {
      bVar12 = true;
      CTcTokenizer::log_error_curtok(in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
    }
    goto LAB_00264984;
  }
  CTcTokenizer::next(in_stack_fffffffffffffe78);
  bVar12 = true;
  goto LAB_00264984;
}

Assistant:

void CTcParser::parse_formal_list(
    int count_only, int opt_allowed,
    int *argc, int *opt_argc, int *varargs,
    int *varargs_list, CTcSymLocal **varargs_list_local,
    int *err, int base_formal_num, int for_short_anon_func,
    CTcFormalTypeList **type_list)
{
    CTcSymLocal *lcl = 0;
    CTcToken varname;
    int named_param = FALSE, opt_param = FALSE;
    int is_typed = FALSE;
    int defval_cnt = 0;

    /* 
     *   choose the end token - if this is a normal argument list, the
     *   ending token is a right parenthesis; for a short-form anonymous
     *   function, it's a colon 
     */
    tc_toktyp_t end_tok = (for_short_anon_func ? TOKT_COLON : TOKT_RPAR);
    int missing_end_tok_err = (for_short_anon_func
                           ? TCERR_MISSING_COLON_FORMAL
                           : TCERR_MISSING_RPAR_FORMAL);
    
    /* no arguments yet */
    *argc = 0;
    if (opt_argc != 0)
        *opt_argc = 0;
    *varargs = FALSE;
    *varargs_list = FALSE;

    /* no error yet */
    *err = FALSE;

    /* we've only just begun */
    int done = FALSE;

    /* check for an empty list */
    if (G_tok->cur() == end_tok)
    {
        /* the list is empty - we're already done */
        done = TRUE;

        /* skip the closing token */
        G_tok->next();
    }

    /* keep going until done */
    while (!done)
    {
        tc_toktyp_t suffix_tok = TOKT_INVALID;
        CTcPrsNode *defval_expr = 0;

        /* see what comes next */
        switch(G_tok->cur())
        {
        case TOKT_ELLIPSIS:
            /* it's an ellipsis - note that we have varargs */
            *varargs = TRUE;

        parse_ellipsis:
            /* add the varargs indicator to the formal type list */
            if (type_list != 0 && *type_list != 0)
                (*type_list)->add_ellipsis();

            /* the next token must be the close paren */
            if (G_tok->next() == end_tok)
            {
                /* we've reached the end of the list */
                goto handle_end_tok;
            }
            else
            {
                /* this is an error - guess about the problem */
                switch(G_tok->cur())
                {
                case TOKT_COMMA:
                    /* 
                     *   we seem to have more in the list - log an error,
                     *   but continue parsing the list 
                     */
                    G_tok->next();
                    G_tok->log_error(TCERR_ELLIPSIS_NOT_LAST);
                    break;
                    
                default:
                    /* 
                     *   anything else is probably a missing right paren -
                     *   provide it and exit the formal list 
                     */
                    done = TRUE;
                    G_tok->log_error_curtok(missing_end_tok_err);
                    break;
                }
            }
            break;
            
        case TOKT_LBRACK:
            /* 
             *   varargs with named list variable for last parameter -
             *   this generates setup code that stores the arguments from
             *   this one forward in a list to be stored in this variable 
             */

            /* note that we have varargs */
            *varargs = TRUE;

            /* note it in the type list as well */
            if (type_list != 0 && *type_list != 0)
                (*type_list)->add_ellipsis();

            /* skip the bracket and check that a symbol follows */
            switch(G_tok->next())
            {
            case TOKT_RBRACK:
                /* 
                 *   empty brackets - treat this as identical to an
                 *   ellipsis; since they didn't name the varargs list
                 *   parameter, it's just a varargs indication 
                 */
                goto parse_ellipsis;
                
            case TOKT_SYM:
                /* if we're creating a symbol table, add the symbol */
                if (!count_only)
                {
                    int local_id;
                    
                    /* create a local scope if we haven't already */
                    create_scope_local_symtab();

                    /* note that we have a varargs list parameter */
                    *varargs_list = TRUE;

                    /* 
                     *   insert the new variable as a local - it's not a
                     *   formal, since we're going to take the actuals,
                     *   make a list, and store them in this local; the
                     *   formal in this position will not be named, since
                     *   this is a varargs function 
                     */
                    local_id = alloc_local();
                    *varargs_list_local = local_symtab_->add_local(
                        G_tok->getcur()->get_text(),
                        G_tok->getcur()->get_text_len(),
                        local_id, FALSE, TRUE, FALSE);

                    /* mark it as a list parameter */
                    (*varargs_list_local)->set_list_param(TRUE);
                }

                /* a close bracket must follow */
                switch (G_tok->next())
                {
                case TOKT_RBRACK:
                    /* skip the close bracket, and check for the end token */
                    if (G_tok->next() == end_tok)
                    {
                        /* that's it - the list is done */
                        goto handle_end_tok;
                    }

                    /* we didn't find the end token - guess about the error */
                    switch (G_tok->cur())
                    {
                    case TOKT_COMMA:
                        /* 
                         *   they seem to want another parameter - this is
                         *   an error, but keep parsing anyway 
                         */
                        G_tok->log_error(TCERR_LISTPAR_NOT_LAST);
                        break;

                    case TOKT_LBRACE:
                    case TOKT_RBRACE:
                    case TOKT_LPAR:
                    case TOKT_EOF:
                        /* the ending token was probably just forgotten */
                        G_tok->log_error_curtok(missing_end_tok_err);

                        /* presume that the argument list is done */
                        done = TRUE;
                        break;

                    default:
                        /* end token is missing - log an error */
                        G_tok->log_error_curtok(missing_end_tok_err);

                        /* 
                         *   skip the errant token; if the ending token
                         *   follows this one, skip it as well, since
                         *   there's probably just a stray extra token
                         *   before the ending token 
                         */
                        if (G_tok->next() == end_tok)
                            G_tok->next();

                        /* presume they simply left out the paren */
                        done = TRUE;
                        break;
                    }
                    break;

                case TOKT_LBRACE:
                case TOKT_RBRACE:
                case TOKT_EOF:
                    /* they must have left out the bracket and paren */
                    G_tok->log_error_curtok(TCERR_LISTPAR_REQ_RBRACK);
                    done = TRUE;
                    break;
                    
                default:
                    /* note the missing bracket */
                    G_tok->log_error_curtok(TCERR_LISTPAR_REQ_RBRACK);

                    /* skip the errant token and assume we're done */
                    G_tok->next();
                    done = TRUE;
                    break;
                }
                break;

            default:
                /* log an error */
                G_tok->log_error_curtok(TCERR_LISTPAR_REQ_SYM);

                /* if this is the ending token, we're done */
                if (G_tok->cur() == end_tok)
                    goto handle_end_tok;

                /* 
                 *   if we're not on something that looks like the end of
                 *   the parameter list, skip the errant token 
                 */
                switch(G_tok->cur())
                {
                case TOKT_RBRACE:
                case TOKT_LBRACE:
                case TOKT_EOF:
                    /* looks like they left out the closing markers */
                    done = TRUE;
                    break;

                default:
                    /* 
                     *   skip the errant token and continue - they
                     *   probably have more argument list following 
                     */
                    G_tok->next();
                    break;
                }
                break;
            }
            break;

        case TOKT_SYM:
            /*
             *   If a formal type list is allowed, check to see if the next
             *   token is a symbol - if it is, the current token is the type,
             *   and the next token is the variable name. 
             */
            is_typed = FALSE;
            if (type_list != 0)
            {
                /* save the initial token */
                CTcToken init_tok = *G_tok->copycur();

                /* check the next one */
                if (G_tok->next() == TOKT_SYM)
                {
                    /* 
                     *   We have another symbol, so the first token is the
                     *   type name, and the current token is the param name.
                     *   Add the type to the formal type list.
                     */

                    /* first, make sure we've created the type list */
                    if (*type_list == 0)
                    {
                        /* 
                         *   We haven't created one yet - create it now.
                         *   Since we're just getting around to creating the
                         *   list, add untyped elements for the parameters
                         *   we've seen so far - they all must have been
                         *   untyped, since we create the list on
                         *   encountering the first typed parameter.  
                         */
                        *type_list = new (G_prsmem) CTcFormalTypeList();
                        (*type_list)->add_untyped_params(*argc);
                    }

                    /* add this typed parameter */
                    (*type_list)->add_typed_param(&init_tok);

                    /* flag it as typed */
                    is_typed = TRUE;
                    
                    /* 
                     *   make sure the type symbol is defined as a class or
                     *   object 
                     */
                    CTcSymbol *clsym = global_symtab_->find(
                        init_tok.get_text(), init_tok.get_text_len());
                    if (clsym == 0)
                    {
                        /* it's not defined - add it as an external object */
                        clsym = new CTcSymObj(
                            init_tok.get_text(), init_tok.get_text_len(),
                            FALSE, G_cg->new_obj_id(), TRUE,
                            TC_META_TADSOBJ, 0);

                        /* mark it as referenced */
                        clsym->mark_referenced();

                        /* add it to the table */
                        global_symtab_->add_entry(clsym);
                    }
                    else if (clsym->get_type() != TC_SYM_OBJ
                             && clsym->get_type() != TC_SYM_METACLASS)
                    {
                        /* it's something other than an object */
                        G_tok->log_error(TCERR_MMPARAM_NOT_OBJECT,
                                         (int)init_tok.get_text_len(),
                                         init_tok.get_text());
                    }
                }
                else
                {
                    /* there's no type name - back up to the param name */
                    G_tok->unget();

                    /*
                     *   We need to add an untyped element to the type list,
                     *   but don't do so quite yet - we need to make sure
                     *   that this isn't a named argument parameter.  Only
                     *   positional elements go in the type list.  For now,
                     *   simply flag it as non-typed.  
                     */
                    is_typed = FALSE;
                }
            }

            /* remember and skip the symbol name */
            varname = *G_tok->getcur();
            G_tok->next();

            /* check for a colon, which might indicate a named parameter */
            named_param = FALSE;
            if (G_tok->cur() == TOKT_COLON)
            {
                /* it looks like a named param so far */
                named_param = TRUE;

                /*
                 *   There's one case where a colon *doesn't* indicate a
                 *   named parameter, which is when it's the closing colon of
                 *   a short-form anonymous function parameter list.  For
                 *   those, the colon is a name marker only if it's followed
                 *   by a continuation of the formal list: specifically,
                 *   another parameter (so, a comma), or ':' to indicate the
                 *   actual end of the list.  If anything else follows, the
                 *   colon is the terminator rather than part of the formal
                 *   list.  
                 */
                if (for_short_anon_func)
                {
                    /* check the next token */
                    switch (G_tok->next())
                    {
                    case TOKT_COMMA:
                    case TOKT_COLON:
                        /* 
                         *   More list follows, so this is indeed a named
                         *   parameter marker. 
                         */
                        break;
                        
                    default:
                        /* 
                         *   We don't have more list, so this colon is the
                         *   end marker for the formal list.  Put it back and
                         *   continue.  
                         */
                        named_param = FALSE;
                        G_tok->unget();
                        break;
                    }
                }
                else
                {
                    /* 
                     *   for regular argument lists, this can only be a named
                     *   parameter indicator; skip it
                     */
                    G_tok->next();
                }

                /* named parameters can't be typed */
                if (named_param && is_typed)
                {
                    G_tok->log_error(TCERR_NAMED_ARG_NO_TYPE,
                                     (int)varname.get_text_len(),
                                     varname.get_text());
                }
            }
            
            /* 
             *   check for an optionality flag (a '?' suffix) or a default
             *   value ('= <expression>') 
             */
            opt_param = FALSE;
            suffix_tok = G_tok->cur();
            defval_expr = 0;
            if (opt_allowed
                && (suffix_tok == TOKT_QUESTION || suffix_tok == TOKT_EQ))
            {
                /* it's optional */
                opt_param = TRUE;
                
                /* count the optional argument */
                if (opt_argc != 0 && !named_param)
                    ++(*opt_argc);

                /* skip the suffix token */
                G_tok->next();
                
                /* if it was an '=', parse the default value expression */
                if (suffix_tok == TOKT_EQ)
                {
                    /* 
                     *   parse the expression - comma has precedence in this
                     *   context as an argument separator, so we need to
                     *   parse this as an assignment expression (this is for
                     *   precedence reasons, NOT because it's syntactically
                     *   like an assignment - the '=' postfix to the argument
                     *   name isn't part of the expression we're parsing) 
                     */
                    defval_expr = parse_asi_expr();
                }
            }

            /* 
             *   if any previous arguments are optional, all subsequent
             *   arguments must be optional as well 
             */
            if (opt_allowed
                && opt_argc != 0 && *opt_argc != 0
                && !opt_param && !named_param)
            {
                /* flag it as an error */
                G_tok->log_error(TCERR_ARG_MUST_BE_OPT,
                                 (int)varname.get_text_len(),
                                 varname.get_text());
            }
            
            /* if we're creating symbol table entries, add this symbol */
            lcl = 0;
            if (!count_only)
            {
                /* 
                 *   create a new local symbol table if we don't already have
                 *   one 
                 */
                create_scope_local_symtab();

                /*
                 *   Insert the new variable for the formal.  If it's a named
                 *   parameter or an optional parameter, it's not a real
                 *   formal, since it doesn't point directly to a parameter
                 *   slot in the stack frame - it points instead to a regular
                 *   local variable slot that we have to set up with
                 *   generated code in the function prolog.  
                 */
                if (named_param || opt_param)
                {
                    /* it's a pseudo-formal - create a local for it */
                    lcl = local_symtab_->add_local(
                        varname.get_text(), varname.get_text_len(),
                        alloc_local(), FALSE, FALSE, FALSE);

                    /* set the special flags */
                    lcl->set_named_param(named_param);
                    lcl->set_opt_param(opt_param);

                    /* remember the default value expression, if any */
                    if (defval_expr != 0)
                        lcl->set_defval_expr(defval_expr, defval_cnt++);
                }
                else
                {
                    /* insert the new local variable for the formal */
                    lcl = local_symtab_->add_formal(
                        varname.get_text(), varname.get_text_len(),
                        base_formal_num + *argc, FALSE);
                }

                /* 
                 *   If it's a position parameter, set its parameter index.
                 *   Since optional parameters are actually stored as local
                 *   variables, we need to separately track the parameter
                 *   list index so that we can load the value into the local
                 *   on function entry.  
                 */
                if (!named_param && lcl != 0)
                    lcl->set_param_index(*argc);
            }

            /* 
             *   If it's not a named parameter, count it.  Named parameters
             *   don't count as formals since they're not part of the
             *   positional list and aren't in the parameter area of the
             *   stack frame. 
             */
            if (!named_param)
            {
                /* count it in the positional list */
                ++(*argc);

                /* if it was untyped, add it to the type list */
                if (type_list != 0 && *type_list != 0 && !is_typed)
                    (*type_list)->add_untyped_param();
            }

            /* check for the closing token */
            if (G_tok->cur() == end_tok)
            {
                /* it's the closing token - skip it and stop scanning */
                goto handle_end_tok;
            }

            /* check what follows */
            switch (G_tok->cur())
            {
            case TOKT_COMMA:
                /* skip the comma and continue */
                G_tok->next();
                break;

            case TOKT_SEM:
            case TOKT_RBRACE:
            case TOKT_LBRACE:
            case TOKT_EQ:
            case TOKT_EOF:
                /* 
                 *   We've obviously left the list - the problem is
                 *   probably that we're missing the right paren.  Catch
                 *   it in the main loop.  
                 */
                break;

            case TOKT_SYM:
                /* 
                 *   they seem to have left out a comma - keep parsing
                 *   from the symbol token 
                 */
                G_tok->log_error_curtok(TCERR_REQ_COMMA_FORMAL);
                break;

            default:
                /* anything else is an error */
                G_tok->log_error_curtok(TCERR_REQ_COMMA_FORMAL);
                
                /* skip the errant token and continue */
                G_tok->next();
                break;
            }

            /* done with the formal */
            break;

        case TOKT_SEM:
        case TOKT_RBRACE:
        case TOKT_LBRACE:
        case TOKT_EOF:
            /* 
             *   We've obviously left the list - the problem is probably
             *   that we're missing the right paren.  Log an error and
             *   stop scanning.  
             */
            G_tok->log_error_curtok(missing_end_tok_err);
            done = TRUE;
            break;

        default:
            /* check to see if it's the ending token */
            if (G_tok->cur() == end_tok)
            {
                /* 
                 *   they seem to have put in a comma followed by the
                 *   ending token - it's probably just a stray extra comma 
                 */
                G_tok->log_error(TCERR_MISSING_LAST_FORMAL);
                
                /* skip the paren and stop scanning */
                G_tok->next();
                done = TRUE;
                break;
            }

            /*
             *   If this is a short-form anonymous function's parameter
             *   list, they probably forgot the colon - generate a more
             *   specific error for this case, and assume the list ends
             *   here.  
             */
            if (for_short_anon_func)
            {
                /* tell them they left out the colon */
                G_tok->log_error_curtok(TCERR_MISSING_COLON_FORMAL);
                
                /* presume the argument list was meant to end here */
                done = TRUE;
                break;
            }
            
            /* 
             *   anything else is probably just an extraneous token; skip
             *   it and go on 
             */
            G_tok->log_error_curtok(TCERR_REQ_SYM_FORMAL);
            G_tok->next();
            break;

        handle_end_tok:
            /* we've reached the end token - skip it, and we're done */
            G_tok->next();
            done = TRUE;
            break;
        }
    }

    /*
     *   Check for the "multimethod" modifier, if allowed.  It's allowed if a
     *   formal type list is allowed and this is a normal full parameter list
     *   (i.e., specified in parentheses rather than as an anonymous function
     *   formal list).  
     */
    if (G_tok->cur() == TOKT_SYM
        && G_tok->cur_tok_matches("multimethod", 11))
    {
        /* make sure it's allowed */
        if (type_list != 0 && end_tok == TOKT_RPAR)
        {
            /* it's allowed - create the type list if we haven't already */
            if (*type_list == 0)
            {
                /* create the type list */
                *type_list = new (G_prsmem) CTcFormalTypeList();

                /* add untyped parameters for the ones we've defined */
                (*type_list)->add_untyped_params(*argc);

                /* mark it as varargs if applicable */
                if (*varargs)
                    (*type_list)->add_ellipsis();
            }
        }
        else
        {
            /* it's not allowed - flag it as an error */
            G_tok->log_error(TCERR_MULTIMETHOD_NOT_ALLOWED);
        }

        /* skip the token */
        G_tok->next();
    }

    /* deduct the optional arguments from the fixed arguments */
    if (opt_argc != 0)
        *argc -= *opt_argc;
}